

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_ctor_and_move_unit_test.cpp
# Opt level: O2

void print_simplex_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>>
               (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *st,string *msg)

{
  pointer pvVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
  *ppVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  int iVar5;
  ostream *poVar6;
  pointer pvVar7;
  Filtration_value *pFVar8;
  string *__return_storage_ptr__;
  int vertex;
  Simplex_handle local_58;
  string local_50;
  
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::initialize_filtration(st,false)
  ;
  std::operator<<((ostream *)&std::clog,
                  "********************************************************************\n");
  poVar6 = std::operator<<((ostream *)&std::clog,"* ");
  poVar6 = std::operator<<(poVar6,(string *)msg);
  std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<((ostream *)&std::clog,"* The complex contains ");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::num_simplices(st);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
  std::operator<<(poVar6," simplices");
  poVar6 = std::operator<<((ostream *)&std::clog,"   - dimension ");
  iVar5 = Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::dimension(st);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
  std::operator<<(poVar6,"\n");
  std::operator<<((ostream *)&std::clog,
                  "* Iterator on Simplices in the filtration, with [filtration value]:\n");
  Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::maybe_initialize_filtration(st)
  ;
  pvVar1 = (st->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar7 = (st->filtration_vect_).
                super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start; __return_storage_ptr__ = &local_50,
      pvVar7 != pvVar1; pvVar7 = pvVar7 + 1) {
    ppVar2 = pvVar7->m_ptr;
    poVar6 = std::operator<<((ostream *)&std::clog,"   ");
    poVar6 = std::operator<<(poVar6,"[");
    pFVar8 = (Filtration_value *)&ppVar2->second;
    if (ppVar2 == (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
                   *)0x0) {
      pFVar8 = &Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
                Filtration_simplex_base_real::inf_;
    }
    std::__cxx11::to_string
              (__return_storage_ptr__,
               (double)(((Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>
                          *)pFVar8)->super_Filtration_simplex_base).filt_);
    poVar6 = std::operator<<(poVar6,(string *)__return_storage_ptr__);
    std::operator<<(poVar6,"] ");
    std::__cxx11::string::~string((string *)__return_storage_ptr__);
    local_58.m_ptr = ppVar2;
    Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::simplex_vertex_range
              ((Simplex_vertex_range *)__return_storage_ptr__,st,&local_58);
    uVar4 = local_50.field_2._8_4_;
    uVar3 = local_50.field_2._M_allocated_capacity;
    iVar5 = (int)local_50._M_string_length;
    while ((__return_storage_ptr__ = (string *)(__return_storage_ptr__->_M_dataplus)._M_p,
           __return_storage_ptr__ != (string *)uVar3 || (iVar5 != uVar4))) {
      poVar6 = std::operator<<((ostream *)&std::clog,"(");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar5);
      std::operator<<(poVar6,")");
      iVar5 = (int)__return_storage_ptr__->_M_string_length;
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::clog);
  }
  return;
}

Assistant:

void print_simplex_filtration(const Simplex_tree& st, const std::string& msg) {
  // Required before browsing through filtration values
  st.initialize_filtration();

  std::clog << "********************************************************************\n";
  std::clog << "* " << msg << "\n";
  std::clog << "* The complex contains " << st.num_simplices() << " simplices";
  std::clog << "   - dimension " << st.dimension() << "\n";
  std::clog << "* Iterator on Simplices in the filtration, with [filtration value]:\n";
  for (auto f_simplex : st.filtration_simplex_range()) {
    std::clog << "   "
              << "[" << print_filtration_value(st.filtration(f_simplex)) << "] ";
    for (auto vertex : st.simplex_vertex_range(f_simplex)) std::clog << "(" << vertex << ")";
    std::clog << std::endl;
  }

}